

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

bool __thiscall CDirectiveAlignFill::Validate(CDirectiveAlignFill *this,ValidateState *state)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int64_t iVar4;
  char *pcVar5;
  Architecture *pAVar6;
  long *in_RCX;
  long local_60;
  long local_58;
  bool result;
  int64_t mod;
  int64_t oldSize;
  ValidateState *local_20;
  ValidateState *state_local;
  CDirectiveAlignFill *this_local;
  
  local_20 = state;
  state_local = (ValidateState *)this;
  iVar4 = FileManager::getVirtualAddress(g_fileManager);
  this->virtualAddress = iVar4;
  bVar3 = Expression::isLoaded(&this->valueExpression);
  if ((!bVar3) ||
     (bVar3 = Expression::evaluateInteger<long>(&this->valueExpression,&this->value), bVar3)) {
    if ((*(int *)&(this->super_CAssemblerCommand).field_0x14 == 2) ||
       (bVar3 = isPowerOfTwo(this->value), bVar3)) {
      lVar2 = this->finalSize;
      iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
      if (iVar1 == 0) {
        iVar4 = FileManager::getPhysicalAddress(g_fileManager);
        local_60 = iVar4 % this->value;
        if (local_60 == 0) {
          local_60 = 0;
        }
        else {
          local_60 = this->value - local_60;
        }
        this->finalSize = local_60;
      }
      else if (iVar1 == 1) {
        iVar4 = FileManager::getVirtualAddress(g_fileManager);
        local_58 = iVar4 % this->value;
        if (local_58 == 0) {
          local_58 = 0;
        }
        else {
          local_58 = this->value - local_58;
        }
        this->finalSize = local_58;
      }
      else if (iVar1 == 2) {
        this->finalSize = this->value;
      }
      bVar3 = Expression::isLoaded(&this->fillExpression);
      if ((!bVar3) ||
         (bVar3 = Expression::evaluateInteger<signed_char>(&this->fillExpression,&this->fillByte),
         bVar3)) {
        pAVar6 = Architecture::current();
        (*pAVar6->_vptr_Architecture[3])();
        FileManager::advanceMemory(g_fileManager,this->finalSize);
        this_local._7_1_ = lVar2 != this->finalSize;
      }
      else {
        Logger::printError<>(FatalError,"Invalid fill value");
        this_local._7_1_ = false;
      }
    }
    else {
      Logger::queueError<long>((Logger *)0x1,0x22953b,(char *)&this->value,in_RCX);
      this_local._7_1_ = false;
    }
  }
  else {
    pcVar5 = "alignment";
    if (*(int *)&(this->super_CAssemblerCommand).field_0x14 == 2) {
      pcVar5 = "size";
    }
    oldSize = (int64_t)pcVar5;
    Logger::queueError<char_const*>((Logger *)0x2,0x229526,(char *)&oldSize,(char **)0x22cc0a);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CDirectiveAlignFill::Validate(const ValidateState &state)
{
	virtualAddress = g_fileManager->getVirtualAddress();

	if (valueExpression.isLoaded())
	{
		if (!valueExpression.evaluateInteger(value))
		{
			Logger::queueError(Logger::FatalError, "Invalid %s",mode == Fill ? "size" : "alignment");
			return false;
		}
	}

	if (mode != Fill && !isPowerOfTwo(value))
	{
		Logger::queueError(Logger::Error, "Invalid alignment %d", value);
		return false;
	}

	int64_t oldSize = finalSize;
	int64_t mod;
	switch (mode)
	{
	case AlignVirtual:
		mod = g_fileManager->getVirtualAddress() % value;
		finalSize = mod ? value-mod : 0;
		break;
	case AlignPhysical:
		mod = g_fileManager->getPhysicalAddress() % value;
		finalSize = mod ? value-mod : 0;
		break;
	case Fill:
		finalSize = value;
		break;
	}

	if (fillExpression.isLoaded())
	{
		if (!fillExpression.evaluateInteger(fillByte))
		{
			Logger::printError(Logger::FatalError, "Invalid fill value");
			return false;
		}
	}

	Architecture::current().NextSection();
	g_fileManager->advanceMemory(finalSize);

	bool result = oldSize != finalSize;
	oldSize = finalSize;
	return result;
}